

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.h
# Opt level: O0

SoundAnalysisPreprocessing_Vggish * __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::mutable_vggish
          (SoundAnalysisPreprocessing *this)

{
  bool bVar1;
  SoundAnalysisPreprocessing_Vggish *this_00;
  SoundAnalysisPreprocessing *this_local;
  
  bVar1 = has_vggish(this);
  if (!bVar1) {
    clear_SoundAnalysisPreprocessingType(this);
    set_has_vggish(this);
    this_00 = (SoundAnalysisPreprocessing_Vggish *)operator_new(0x18);
    SoundAnalysisPreprocessing_Vggish::SoundAnalysisPreprocessing_Vggish(this_00);
    (this->SoundAnalysisPreprocessingType_).vggish_ = this_00;
  }
  return (this->SoundAnalysisPreprocessingType_).vggish_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish* SoundAnalysisPreprocessing::mutable_vggish() {
  if (!has_vggish()) {
    clear_SoundAnalysisPreprocessingType();
    set_has_vggish();
    SoundAnalysisPreprocessingType_.vggish_ = new ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.vggish)
  return SoundAnalysisPreprocessingType_.vggish_;
}